

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Rep *pRVar1;
  Rep *pRVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  LogMessage *pLVar6;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (this == other) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0xa11);
    pLVar6 = LogMessage::operator<<(&local_60,"CHECK failed: this != other: ");
    LogFinisher::operator=(&local_21,pLVar6);
    LogMessage::~LogMessage(&local_60);
  }
  if (this->arena_ != other->arena_) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0xa12);
    pLVar6 = LogMessage::operator<<(&local_60,"CHECK failed: GetArena() == other->GetArena(): ");
    LogFinisher::operator=(&local_21,pLVar6);
    LogMessage::~LogMessage(&local_60);
  }
  iVar4 = this->current_size_;
  iVar5 = this->total_size_;
  pRVar1 = this->rep_;
  iVar3 = other->total_size_;
  pRVar2 = other->rep_;
  this->current_size_ = other->current_size_;
  this->total_size_ = iVar3;
  this->rep_ = pRVar2;
  other->current_size_ = iVar4;
  other->total_size_ = iVar5;
  other->rep_ = pRVar1;
  return;
}

Assistant:

void RepeatedPtrFieldBase::InternalSwap(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(this != other);
  GOOGLE_DCHECK(GetArena() == other->GetArena());

  // Swap all fields at once.
  static_assert(std::is_standard_layout<RepeatedPtrFieldBase>::value,
                "offsetof() requires standard layout before c++17");
  internal::memswap<offsetof(RepeatedPtrFieldBase, rep_) + sizeof(this->rep_) -
                    offsetof(RepeatedPtrFieldBase, current_size_)>(
      reinterpret_cast<char*>(this) +
          offsetof(RepeatedPtrFieldBase, current_size_),
      reinterpret_cast<char*>(other) +
          offsetof(RepeatedPtrFieldBase, current_size_));
}